

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOIL.c
# Opt level: O0

int query_DXT_capability(void)

{
  P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC p_Var1;
  char *pcVar2;
  P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC p_Var3;
  P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC ext_addr;
  
  if (has_DXT_capability == -1) {
    pcVar2 = (char *)glGetString(0x1f03);
    pcVar2 = strstr(pcVar2,"GL_EXT_texture_compression_s3tc");
    if (pcVar2 == (char *)0x0) {
      has_DXT_capability = 0;
    }
    else {
      p_Var3 = (P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC)glXGetProcAddressARB("glCompressedTexImage2DARB");
      p_Var1 = p_Var3;
      if (p_Var3 == (P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC)0x0) {
        p_Var1 = soilGlCompressedTexImage2D;
      }
      soilGlCompressedTexImage2D = p_Var1;
      has_DXT_capability = (int)(p_Var3 != (P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC)0x0);
    }
  }
  return has_DXT_capability;
}

Assistant:

int query_DXT_capability( void )
{
	/*	check for the capability	*/
	if( has_DXT_capability == SOIL_CAPABILITY_UNKNOWN )
	{
		/*	we haven't yet checked for the capability, do so	*/
		if( NULL == strstr(
				(char const*)glGetString( GL_EXTENSIONS ),
				"GL_EXT_texture_compression_s3tc" ) )
		{
			/*	not there, flag the failure	*/
			has_DXT_capability = SOIL_CAPABILITY_NONE;
		} else
		{
			/*	and find the address of the extension function	*/
			P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC ext_addr = NULL;
			#ifdef WIN32
				ext_addr = (P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC)
						wglGetProcAddress
						(
							"glCompressedTexImage2DARB"
						);
			#elif defined(__APPLE__) || defined(__APPLE_CC__)
				/*	I can't test this Apple stuff!	*/
				CFBundleRef bundle;
				CFURLRef bundleURL =
					CFURLCreateWithFileSystemPath(
						kCFAllocatorDefault,
						CFSTR("/System/Library/Frameworks/OpenGL.framework"),
						kCFURLPOSIXPathStyle,
						true );
				CFStringRef extensionName =
					CFStringCreateWithCString(
						kCFAllocatorDefault,
						"glCompressedTexImage2DARB",
						kCFStringEncodingASCII );
				bundle = CFBundleCreate( kCFAllocatorDefault, bundleURL );
				assert( bundle != NULL );
				ext_addr = (P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC)
						CFBundleGetFunctionPointerForName
						(
							bundle, extensionName
						);
				CFRelease( bundleURL );
				CFRelease( extensionName );
				CFRelease( bundle );
			#else
				ext_addr = (P_SOIL_GLCOMPRESSEDTEXIMAGE2DPROC)
						glXGetProcAddressARB
						(
							(const GLubyte *)"glCompressedTexImage2DARB"
						);
			#endif
			/*	Flag it so no checks needed later	*/
			if( NULL == ext_addr )
			{
				/*	hmm, not good!!  This should not happen, but does on my
					laptop's VIA chipset.  The GL_EXT_texture_compression_s3tc
					spec requires that ARB_texture_compression be present too.
					this means I can upload and have the OpenGL drive do the
					conversion, but I can't use my own routines or load DDS files
					from disk and upload them directly [8^(	*/
				has_DXT_capability = SOIL_CAPABILITY_NONE;
			} else
			{
				/*	all's well!	*/
				soilGlCompressedTexImage2D = ext_addr;
				has_DXT_capability = SOIL_CAPABILITY_PRESENT;
			}
		}
	}
	/*	let the user know if we can do DXT or not	*/
	return has_DXT_capability;
}